

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_id_unix.h
# Opt level: O0

bool CpuInformation::isSseSupported(void)

{
  int *piVar1;
  long lVar2;
  int id;
  int info [4];
  undefined1 local_1;
  
  piVar1 = (int *)cpuid_basic_info(0);
  if (*piVar1 < 1) {
    local_1 = false;
  }
  else {
    lVar2 = cpuid_Version_info(1);
    local_1 = (*(uint *)(lVar2 + 8) & 0x4000000) != 0;
  }
  return local_1;
}

Assistant:

static bool isSseSupported()
    {
#ifndef __arm__
        int info[4];
        __cpuid_count( 0, 0, info[0], info[1], info[2], info[3] );
        const int id = info[0];

        if( id >= 0x00000001 ) {
            __cpuid_count( 0x00000001, 0, info[0], info[1], info[2], info[3] );
            return (info[3] & ((int)1 << 26)) != 0;
        }
#endif
        return false;
    }